

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineGLImplTraits>::UpdateBuffer
          (DeviceContextBase<Diligent::EngineGLImplTraits> *this,IBuffer *pBuffer,Uint64 Offset,
          Uint64 Size,void *pData,RESOURCE_STATE_TRANSITION_MODE StateTransitionMode)

{
  BufferDesc *Args;
  Uint32 *pUVar1;
  COMMAND_QUEUE_TYPE CVar2;
  BufferGLImpl *pBVar3;
  pointer pcVar4;
  Uint64 extraout_RDX;
  Uint64 UVar5;
  char *pcVar6;
  undefined7 in_register_00000089;
  char (*Args_3) [8];
  Uint64 *Args_6;
  string msg;
  Uint64 Offset_local;
  String local_50;
  
  Args_3 = (char (*) [8])CONCAT71(in_register_00000089,StateTransitionMode);
  CVar2 = (this->m_Desc).QueueType;
  UVar5 = Offset;
  Offset_local = Offset;
  if (CVar2 == COMMAND_QUEUE_TYPE_UNKNOWN) {
    if ((this->m_Desc).IsDeferred == false) {
      FormatString<char[79]>
                (&msg,(char (*) [79])
                      "Queue type may never be unknown for immediate contexts. This looks like a bug."
                );
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"UpdateBuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x6b8);
      std::__cxx11::string::~string((string *)&msg);
    }
    FormatString<char[97]>
              (&msg,(char (*) [97])
                    "Queue type is UNKNOWN. This indicates that Begin() has never been called for a deferred context."
              );
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"UpdateBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x6b8);
    std::__cxx11::string::~string((string *)&msg);
    CVar2 = (this->m_Desc).QueueType;
    UVar5 = extraout_RDX;
  }
  if ((CVar2 & COMMAND_QUEUE_TYPE_TRANSFER) == COMMAND_QUEUE_TYPE_UNKNOWN) {
    GetCommandQueueTypeString_abi_cxx11_
              (&local_50,(Diligent *)(ulong)CVar2,(COMMAND_QUEUE_TYPE)UVar5);
    pcVar6 = " queue.";
    FormatString<char[13],char[22],std::__cxx11::string,char[8]>
              (&msg,(Diligent *)0x6ea0f4,(char (*) [13])0x7e8bba,(char (*) [22])&local_50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" queue.",Args_3
              );
    std::__cxx11::string::~string((string *)&local_50);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"UpdateBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x6b8);
    std::__cxx11::string::~string((string *)&msg);
    pData = pcVar6;
  }
  if (pBuffer == (IBuffer *)0x0) {
    FormatString<char[24]>(&msg,(char (*) [24])0x7eaa28);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"UpdateBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x6b9);
    std::__cxx11::string::~string((string *)&msg);
  }
  if ((this->m_pActiveRenderPass).m_pObject != (RenderPassGLImpl *)0x0) {
    FormatString<char[58]>
              (&msg,(char (*) [58])"UpdateBuffer command must be used outside of render pass.");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"UpdateBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x6ba);
    std::__cxx11::string::~string((string *)&msg);
  }
  pBVar3 = ClassPtrCast<Diligent::BufferGLImpl,Diligent::IBuffer>(pBuffer);
  Args = &(pBVar3->super_BufferBase<Diligent::EngineGLImplTraits>).
          super_DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
          .m_Desc;
  if (((pBVar3->super_BufferBase<Diligent::EngineGLImplTraits>).
       super_DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
       .m_Desc.Usage | USAGE_UNIFIED) != USAGE_SPARSE) {
    FormatString<char[26],char_const*,char[79]>
              (&msg,(Diligent *)"Unable to update buffer \'",(char (*) [26])Args,
               (char **)
               "\': only USAGE_DEFAULT or USAGE_SPARSE buffers can be updated with UpdateData()",
               (char (*) [79])pData);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"UpdateBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x6be);
    std::__cxx11::string::~string((string *)&msg);
  }
  Args_6 = &(pBVar3->super_BufferBase<Diligent::EngineGLImplTraits>).
            super_DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
            .m_Desc.Size;
  pcVar4 = (pointer)(pBVar3->super_BufferBase<Diligent::EngineGLImplTraits>).
                    super_DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
                    .m_Desc.Size;
  if (pcVar4 <= Offset) {
    FormatString<char[26],char_const*,char[12],unsigned_long,char[28],unsigned_long,char[2]>
              (&msg,(Diligent *)"Unable to update buffer \'",(char (*) [26])Args,
               (char **)"\': offset (",(char (*) [12])&Offset_local,
               (unsigned_long *)") exceeds the buffer size (",(char (*) [28])Args_6,
               (unsigned_long *)0x801c00,(char (*) [2])msg._M_dataplus._M_p);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"UpdateBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x6bf);
    std::__cxx11::string::~string((string *)&msg);
    pcVar4 = (pointer)*Args_6;
    Offset = Offset_local;
  }
  local_50._M_dataplus._M_p = (pointer)(Offset + Size);
  if (pcVar4 < local_50._M_dataplus._M_p) {
    FormatString<char[26],char_const*,char[19],unsigned_long,char[2],unsigned_long,char[30],unsigned_long,char[2]>
              (&msg,(Diligent *)"Unable to update buffer \'",(char (*) [26])Args,
               (char **)"\': Update region [",(char (*) [19])&Offset_local,(unsigned_long *)0x73518b
               ,(char (*) [2])&local_50,(unsigned_long *)") is out of buffer bounds [0,",
               (char (*) [30])Args_6,(unsigned_long *)0x801c00,(char (*) [2])msg._M_dataplus._M_p);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"UpdateBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x6c0);
    std::__cxx11::string::~string((string *)&msg);
  }
  pUVar1 = &(this->m_Stats).CommandCounters.UpdateBuffer;
  *pUVar1 = *pUVar1 + 1;
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::UpdateBuffer(
    IBuffer*                       pBuffer,
    Uint64                         Offset,
    Uint64                         Size,
    const void*                    pData,
    RESOURCE_STATE_TRANSITION_MODE StateTransitionMode)
{
    DVP_CHECK_QUEUE_TYPE_COMPATIBILITY(COMMAND_QUEUE_TYPE_TRANSFER, "UpdateBuffer");
    DEV_CHECK_ERR(pBuffer != nullptr, "Buffer must not be null");
    DEV_CHECK_ERR(m_pActiveRenderPass == nullptr, "UpdateBuffer command must be used outside of render pass.");
#ifdef DILIGENT_DEVELOPMENT
    {
        const BufferDesc& BuffDesc = ClassPtrCast<BufferImplType>(pBuffer)->GetDesc();
        DEV_CHECK_ERR(BuffDesc.Usage == USAGE_DEFAULT || BuffDesc.Usage == USAGE_SPARSE, "Unable to update buffer '", BuffDesc.Name, "': only USAGE_DEFAULT or USAGE_SPARSE buffers can be updated with UpdateData()");
        DEV_CHECK_ERR(Offset < BuffDesc.Size, "Unable to update buffer '", BuffDesc.Name, "': offset (", Offset, ") exceeds the buffer size (", BuffDesc.Size, ")");
        DEV_CHECK_ERR(Size + Offset <= BuffDesc.Size, "Unable to update buffer '", BuffDesc.Name, "': Update region [", Offset, ",", Size + Offset, ") is out of buffer bounds [0,", BuffDesc.Size, ")");
    }
#endif

    ++m_Stats.CommandCounters.UpdateBuffer;
}